

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enigma.h
# Opt level: O0

bool ClownLZSS::EnigmaCompress<std::ofstream&>
               (uchar *data,size_t data_size,basic_ofstream<char,_std::char_traits<char>_> *output)

{
  bool bVar1;
  difference_type dVar2;
  undefined1 auStack_38 [7];
  bool success;
  pos_type start;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> output_wrapped;
  basic_ofstream<char,_std::char_traits<char>_> *output_local;
  size_t data_size_local;
  uchar *data_local;
  
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>::OutputCommon
            ((CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
             &start._M_state,(ostream *)output);
  _auStack_38 = Internal::
                OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                ::Tell((OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                        *)&start._M_state);
  bVar1 = Internal::Enigma::Compress<std::ofstream>
                    (data,data_size,
                     (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
                     &start._M_state);
  dVar2 = Internal::
          OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Distance((OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      *)&start._M_state,(pos_type *)auStack_38);
  if (dVar2 % 2 != 0) {
    Internal::
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             *)&start._M_state,'\0');
  }
  return bVar1;
}

Assistant:

bool EnigmaCompress(const unsigned char* const data, const std::size_t data_size, T &&output)
	{
		using namespace Internal;

		CompressorOutput output_wrapped(std::forward<T>(output));

		const auto start = output_wrapped.Tell();
		const bool success = Enigma::Compress(data, data_size, output_wrapped);

		if (output_wrapped.Distance(start) % 2 != 0)
			output_wrapped.Write(0);

		return success;
	}